

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::CreateShaderResourceBinding
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IShaderResourceBinding **ppShaderResourceBinding,bool InitStaticResources)

{
  RenderDeviceGLImpl *pRVar1;
  ShaderResourceBindingGLImpl *this_00;
  PipelineResourceSignatureImplType *pThisImpl;
  string msg;
  PipelineResourceSignatureGLImpl *local_50;
  undefined1 local_48 [24];
  char *local_30;
  undefined4 local_28;
  
  if (ppShaderResourceBinding == (IShaderResourceBinding **)0x0) {
    FormatString<char[41]>
              ((string *)local_48,(char (*) [41])"ppShaderResourceBinding must not be null");
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"CreateShaderResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x211);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    if (*ppShaderResourceBinding != (IShaderResourceBinding *)0x0) {
      FormatString<char[77]>
                ((string *)local_48,
                 (char (*) [77])
                 "Overwriting existing shader resource binding pointer may cause memory leaks.");
      DebugAssertionFailed
                ((Char *)local_48._0_8_,"CreateShaderResourceBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x214);
      std::__cxx11::string::~string((string *)local_48);
    }
    local_50 = (PipelineResourceSignatureGLImpl *)this;
    pRVar1 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        );
    local_48._0_8_ = &(pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_SRBAllocator;
    local_48._8_8_ = 0;
    local_48._16_8_ = "ShaderResourceBinding instance";
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
    ;
    local_28 = 0x218;
    this_00 = MakeNewRCObj<Diligent::ShaderResourceBindingGLImpl,Diligent::FixedBlockMemoryAllocator>
              ::operator()((MakeNewRCObj<Diligent::ShaderResourceBindingGLImpl,Diligent::FixedBlockMemoryAllocator>
                            *)local_48,&local_50);
    if (InitStaticResources) {
      InitializeStaticSRBResources
                (&local_50->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                 (IShaderResourceBinding *)this_00);
    }
    ShaderResourceBindingGLImpl::QueryInterface
              (this_00,(INTERFACE_ID *)IID_ShaderResourceBinding,(IObject **)ppShaderResourceBinding
              );
  }
  return;
}

Assistant:

CreateShaderResourceBinding(IShaderResourceBinding** ppShaderResourceBinding,
                                                                bool                     InitStaticResources) override final
    {
        if (ppShaderResourceBinding == nullptr)
        {
            DEV_ERROR("ppShaderResourceBinding must not be null");
            return;
        }
        DEV_CHECK_ERR(*ppShaderResourceBinding == nullptr, "Overwriting existing shader resource binding pointer may cause memory leaks.");

        PipelineResourceSignatureImplType* pThisImpl{static_cast<PipelineResourceSignatureImplType*>(this)};
        FixedBlockMemoryAllocator&         SRBAllocator{pThisImpl->GetDevice()->GetSRBAllocator()};
        ShaderResourceBindingImplType*     pResBindingImpl{NEW_RC_OBJ(SRBAllocator, "ShaderResourceBinding instance", ShaderResourceBindingImplType)(pThisImpl)};
        if (InitStaticResources)
            pThisImpl->InitializeStaticSRBResources(pResBindingImpl);
        pResBindingImpl->QueryInterface(IID_ShaderResourceBinding, reinterpret_cast<IObject**>(ppShaderResourceBinding));
    }